

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

bool __thiscall
tinyusdz::Attribute::get_value<std::vector<double,std::allocator<double>>>
          (Attribute *this,vector<double,_std::allocator<double>_> *v)

{
  pointer pdVar1;
  pointer pdVar2;
  optional<std::vector<double,_std::allocator<double>_>_> local_30;
  
  if ((v != (vector<double,_std::allocator<double>_> *)0x0) &&
     (primvar::PrimVar::get_value<std::vector<double,std::allocator<double>>>(&local_30,&this->_var)
     , local_30.has_value_ == true)) {
    pdVar1 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar2 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_30.contained.data._0_8_;
    (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_30.contained._8_8_;
    (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_30.contained._16_8_;
    if (pdVar1 == (pointer)0x0) {
      return true;
    }
    operator_delete(pdVar1,(long)pdVar2 - (long)pdVar1);
    return true;
  }
  return false;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }